

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

gfield * __thiscall gfield::div2<13>(gfield *this,bigint<13> *x)

{
  if (((this->super_gfint).len < 1) || (((this->super_gfint).digits[0] & 1) == 0)) {
    bigint<13>::rshift<13>(&this->super_gfint,x,1);
  }
  else {
    bigint<13>::add<13,13>(&this->super_gfint,x,&P.super_gfint);
    bigint<13>::rshift(&this->super_gfint,1);
  }
  return this;
}

Assistant:

gfield &div2(const bigint<X_DIGITS> &x)
    {
        if(hasbit(0)) { gfint::add(x, P); rshift(1); }
        else rshift(x, 1);
        return *this;
    }